

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.cpp
# Opt level: O1

void __thiscall
groundupdbext::DefaultQueryResult::DefaultQueryResult(DefaultQueryResult *this,Set *recordKeys)

{
  size_type sVar1;
  _Hashtable<groundupdb::HashedValue,groundupdb::HashedValue,std::allocator<groundupdb::HashedValue>,std::__detail::_Identity,std::equal_to<groundupdb::HashedValue>,std::hash<groundupdb::HashedValue>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *p_Var2;
  __hashtable *__this;
  _Hashtable<groundupdb::HashedValue,_groundupdb::HashedValue,_std::allocator<groundupdb::HashedValue>,_std::__detail::_Identity,_std::equal_to<groundupdb::HashedValue>,_std::hash<groundupdb::HashedValue>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *this_00;
  ulong uVar3;
  __hashtable *__h;
  _Hash_node_base *p_Var4;
  double dVar5;
  _Head_base<0UL,_std::unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>_*,_false>
  local_70;
  HashedValue local_68;
  
  (this->super_IQueryResult)._vptr_IQueryResult = (_func_int **)&PTR__DefaultQueryResult_001d4b78;
  this_00 = (_Hashtable<groundupdb::HashedValue,_groundupdb::HashedValue,_std::allocator<groundupdb::HashedValue>,_std::__detail::_Identity,_std::equal_to<groundupdb::HashedValue>,_std::hash<groundupdb::HashedValue>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             *)operator_new(0x38);
  this_00->_M_buckets = (__buckets_ptr)0x0;
  this_00->_M_bucket_count = 0;
  *(undefined8 *)&this_00->_M_rehash_policy = 0;
  *(size_t *)((long)&this_00->_M_rehash_policy + 8) = 0;
  this_00->_M_before_begin = (_Hash_node_base *)0x0;
  this_00->_M_element_count = 0;
  this_00->_M_single_bucket = (__node_base_ptr)0x0;
  this_00->_M_buckets = &this_00->_M_single_bucket;
  this_00->_M_bucket_count = 1;
  (this_00->_M_rehash_policy)._M_max_load_factor = 1.0;
  *(size_t *)((long)&this_00->_M_rehash_policy + 8) = 0;
  this_00->_M_single_bucket = (__node_base_ptr)0x0;
  (this->m_recordKeys)._M_t.
  super___uniq_ptr_impl<std::unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>,_std::default_delete<std::unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>_*,_std::default_delete<std::unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>_>_>
  .
  super__Head_base<0UL,_std::unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>_*,_false>
  ._M_head_impl =
       (unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>
        *)this_00;
  sVar1 = (((recordKeys->_M_t).
            super___uniq_ptr_impl<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
            .
            super__Head_base<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_false>
           ._M_head_impl)->_M_h)._M_element_count;
  dVar5 = ((double)CONCAT44(0x45300000,(int)(sVar1 >> 0x20)) - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0);
  uVar3 = (ulong)dVar5;
  std::
  _Hashtable<groundupdb::HashedValue,_groundupdb::HashedValue,_std::allocator<groundupdb::HashedValue>,_std::__detail::_Identity,_std::equal_to<groundupdb::HashedValue>,_std::hash<groundupdb::HashedValue>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::rehash(this_00,(long)(dVar5 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3);
  p_Var4 = (((recordKeys->_M_t).
             super___uniq_ptr_impl<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
             .
             super__Head_base<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_false>
            ._M_head_impl)->_M_h)._M_before_begin._M_nxt;
  if (p_Var4 != (_Hash_node_base *)0x0) {
    do {
      p_Var2 = (_Hashtable<groundupdb::HashedValue,groundupdb::HashedValue,std::allocator<groundupdb::HashedValue>,std::__detail::_Identity,std::equal_to<groundupdb::HashedValue>,std::hash<groundupdb::HashedValue>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)(this->m_recordKeys)._M_t.
                  super___uniq_ptr_impl<std::unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>,_std::default_delete<std::unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>_*,_std::default_delete<std::unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>_>_>
                  .
                  super__Head_base<0UL,_std::unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>_*,_false>
                  ._M_head_impl;
      groundupdb::HashedValue::HashedValue(&local_68,(EncodedValue *)(p_Var4 + 1));
      local_70._M_head_impl =
           (unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>
            *)p_Var2;
      std::
      _Hashtable<groundupdb::HashedValue,groundupdb::HashedValue,std::allocator<groundupdb::HashedValue>,std::__detail::_Identity,std::equal_to<groundupdb::HashedValue>,std::hash<groundupdb::HashedValue>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<groundupdb::HashedValue,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<groundupdb::HashedValue,true>>>>
                (p_Var2,&local_68,&local_70);
      local_68._vptr_HashedValue = (_func_int **)&PTR__HashedValue_001d4818;
      if (local_68.m_data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.m_data.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.m_data.
                              super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.m_data.
                              super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      p_Var4 = p_Var4->_M_nxt;
    } while (p_Var4 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

DefaultQueryResult::DefaultQueryResult(Set&& recordKeys)
  : m_recordKeys(std::make_unique<std::unordered_set<HashedKey>>())
{
  m_recordKeys->reserve(recordKeys->size());
  for (auto it = recordKeys->begin(); it != recordKeys->end(); it++) {
    m_recordKeys->insert(HashedKey(*it));
  }
}